

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O3

bool leveldb::GetLengthPrefixedSlice(Slice *input,Slice *result)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  uint32_t len;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = GetVarint32(input,&local_1c);
  if ((bVar2) && (uVar3 = (ulong)local_1c, uVar3 <= input->size_)) {
    pcVar1 = input->data_;
    result->data_ = pcVar1;
    result->size_ = uVar3;
    if (input->size_ < uVar3) {
      __assert_fail("n <= size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/include/leveldb/slice.h"
                    ,0x46,"void leveldb::Slice::remove_prefix(size_t)");
    }
    input->data_ = pcVar1 + uVar3;
    input->size_ = input->size_ - uVar3;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool GetLengthPrefixedSlice(Slice* input, Slice* result) {
  uint32_t len;
  if (GetVarint32(input, &len) && input->size() >= len) {
    *result = Slice(input->data(), len);
    input->remove_prefix(len);
    return true;
  } else {
    return false;
  }
}